

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O0

void __thiscall Snake::Update(Snake *this,Snake *otherSnake)

{
  Snake local_68;
  SDL_Point local_28;
  SDL_Point current_cell;
  SDL_Point prev_cell;
  Snake *otherSnake_local;
  Snake *this_local;
  
  current_cell.x = (int)this->head_x;
  current_cell.y = (int)this->head_y;
  UpdateHead(this);
  local_28.x = (int)this->head_x;
  local_28.y = (int)this->head_y;
  if ((local_28.x != current_cell.x) || (local_28.y != current_cell.y)) {
    Snake(&local_68,otherSnake);
    UpdateBody(this,&local_28,&current_cell,&local_68);
    ~Snake(&local_68);
  }
  return;
}

Assistant:

void Snake::Update(Snake otherSnake) {
  SDL_Point prev_cell{
      static_cast<int>(head_x),
      static_cast<int>(
          head_y)};  // We first capture the head's cell before updating.
  UpdateHead();
  SDL_Point current_cell{
      static_cast<int>(head_x),
      static_cast<int>(head_y)};  // Capture the head's cell after updating.

  // Update all of the body vector items if the snake head has moved to a new
  // cell.
  if (current_cell.x != prev_cell.x || current_cell.y != prev_cell.y) {
    UpdateBody(current_cell, prev_cell, otherSnake);
  }
}